

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O1

void __thiscall xLearn::Metric::Initialize(Metric *this,ThreadPool *pool)

{
  ostream *poVar1;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if (pool != (ThreadPool *)0x0) {
    this->pool_ = pool;
    this->threadNumber_ =
         (long)(pool->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(pool->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
               .super__Vector_impl_data._M_start >> 3;
    return;
  }
  local_5c.severity_ = ERR;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h",
             "");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Initialize","");
  poVar1 = Logger::Start(ERR,&local_38,0x3f,&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK failed ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/metric.h",
             0x54);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"pool",4);
  std::operator<<(poVar1," == NULL \n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

void Initialize(ThreadPool* pool) {
    CHECK_NOTNULL(pool);
    pool_ = pool;
    threadNumber_ = pool_->ThreadNumber();
  }